

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O3

int fp_test(char *infits,char *outfits,char *outfits2)

{
  fitsfile *pfVar1;
  fitsfile *pfVar2;
  fitsfile *pfVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined7 uVar8;
  size_t sVar7;
  long lVar9;
  fitsfile **ppfVar10;
  int iVar11;
  long *plVar12;
  undefined8 *puVar13;
  long *plVar14;
  double *pdVar15;
  byte bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  int iStack0000000000000008;
  float fStack000000000000000c;
  int iStack0000000000000010;
  int iStack0000000000000014;
  uint uStack0000000000000018;
  float fStack000000000000001c;
  float fStack0000000000000020;
  int iStack0000000000000024;
  int iStack0000000000000028;
  float fStack000000000000002c;
  float in_stack_00000030;
  undefined8 in_stack_00000080;
  int in_stack_00000088;
  char in_stack_0000049c;
  fitsfile *outfptr;
  int naxis;
  fitsfile *inputfptr;
  int bitpix;
  int stat;
  int hdunum;
  int tstatus;
  int hdutype;
  fitsfile *tempfile;
  char dtype [8];
  fitsfile *outfptr2;
  float row_cpu;
  float row_elapse;
  double bscale;
  float whole_elapse;
  float whole_cpu;
  int ncols;
  imgstats imagestats;
  LONGLONG nrows;
  long dataend;
  long datastart;
  long headstart;
  long naxes [9];
  char dimen [100];
  double local_908;
  uint local_900;
  double local_8f8;
  double local_8f0;
  double local_8e8;
  double local_8e0;
  double local_8d8;
  fitsfile *local_260;
  int local_254;
  fitsfile *local_250;
  uint local_244;
  int local_240;
  int local_23c;
  uint local_238;
  uint local_234;
  int local_230;
  int local_22c;
  fitsfile *local_228;
  undefined4 local_220 [2];
  double local_218;
  undefined8 local_210;
  fitsfile *local_208;
  float local_200;
  float local_1fc;
  fitsfile *local_1f8;
  undefined8 uStack_1f0;
  double local_1e0;
  char *local_1d8;
  float local_1cc;
  float local_1c8;
  uint local_1c4;
  long *local_1c0;
  imgstats local_1b8;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  LONGLONG local_140;
  long local_138;
  long local_130;
  double local_128;
  undefined8 uStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  long local_f0;
  long local_e8;
  double local_e0 [9];
  char local_98 [104];
  
  bVar16 = 0;
  plVar12 = &DAT_001c9ce0;
  plVar14 = &local_e8;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    *plVar14 = *plVar12;
    plVar12 = plVar12 + 1;
    plVar14 = plVar14 + 1;
  }
  local_23c = 0;
  local_254 = 0;
  local_244 = 0;
  local_230 = 0;
  local_1d8 = infits;
  ffopentest(10,&local_250,infits,0,&local_23c);
  ffinit(&local_260,outfits,&local_23c);
  ffinit(&local_208,outfits2,&local_23c);
  if (local_23c != 0) {
    ffrprt(_stderr,local_23c);
    exit(local_23c);
  }
  local_1c0 = (long *)&stack0x00000038;
  local_238 = 0;
  iVar11 = 0;
  iVar5 = 0;
  do {
    if (iVar5 != 0) {
      if (iVar5 == 0x6b) {
        local_23c = 0;
      }
      ffclos(local_208,&local_23c);
      ffclos(local_260,&local_23c);
      ffclos(local_250,&local_23c);
      if (local_23c != 0) {
        ffrprt(_stderr,local_23c);
      }
      return 0;
    }
    ffghdt(local_250,&local_22c,&local_23c);
    if (local_22c == 0) {
      ffgipr(local_250,9,(int *)&local_244,&local_254,&local_e8,&local_23c);
      iVar11 = 1;
      lVar9 = 0;
      do {
        iVar11 = iVar11 * (int)(&local_e8)[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 9);
    }
    iVar5 = fits_is_compressed_image(local_250,&local_23c);
    if ((((iVar5 == 0) && (local_22c == 0)) && (local_254 != 0)) &&
       ((iVar11 != 0 && (in_stack_00000080._4_4_ != 0)))) {
      if (local_244 - 1 < 0x3f && fStack0000000000000020 != 0.0) {
        local_230 = 0;
        iVar5 = ffgky(local_250,0x52,"BSCALE",&local_1e0,(char *)0x0,&local_230);
        uVar8 = (undefined7)(CONCAT44(extraout_var,iVar5) >> 8);
        if ((local_230 == 0) && ((local_1e0 != 1.0 || (NAN(local_1e0))))) {
          local_210 = CONCAT71(uVar8,1);
          if (local_244 == 0x20) {
            fp_i4stat(local_250,local_254,&local_e8,&local_1b8,&local_23c);
          }
          else {
            fp_i2stat(local_250,local_254,&local_e8,&local_1b8,&local_23c);
          }
          uVar17 = SUB84(local_1b8.noise2,0);
          uVar18 = (int)((ulong)local_1b8.noise2 >> 0x20);
          if (local_1b8.noise3 <= local_1b8.noise2 || local_1b8.noise2 == 0.0) {
            uVar17 = SUB84(local_1b8.noise3,0);
            uVar18 = (int)((ulong)local_1b8.noise3 >> 0x20);
          }
          uVar19 = SUB84(local_1b8.noise5,0);
          uVar20 = (int)((ulong)local_1b8.noise5 >> 0x20);
          if ((double)CONCAT44(uVar18,uVar17) <= local_1b8.noise5 || local_1b8.noise5 == 0.0) {
            uVar19 = uVar17;
            uVar20 = uVar18;
          }
          local_1f8 = (fitsfile *)((double)CONCAT44(uVar20,uVar19) / (double)fStack0000000000000020)
          ;
          ppfVar10 = &local_250;
          if (1.0 < (double)local_1f8) {
            uStack_1f0 = 0;
            fp_tmpnam("Tmpfile3","",tempfilename3);
            ffinit(&local_228,tempfilename3,&local_23c);
            ffghdn(local_250,(int *)&local_234);
            if (local_234 != 1) {
              ffcrim(local_228,8,0,&local_e8,&local_23c);
            }
            ffcphd(local_250,local_228,&local_23c);
            if (local_244 == 0x20) {
              fp_i4rescale(local_250,local_254,&local_e8,(double)local_1f8,local_228,&local_23c);
            }
            else {
              fp_i2rescale(local_250,local_254,&local_e8,(double)local_1f8,local_228,&local_23c);
            }
            local_1e0 = (double)local_1f8 * local_1e0;
            local_210 = 0;
            ffuky(local_228,0x52,"BSCALE",&local_1e0,(char *)0x0,&local_23c);
            ffrdef(local_228,&local_23c);
            ppfVar10 = &local_228;
          }
        }
        else {
          local_210 = CONCAT71(uVar8,1);
          ppfVar10 = &local_250;
        }
      }
      else {
        local_210 = 1;
        ppfVar10 = &local_250;
      }
      local_1f8 = *ppfVar10;
      if ((int)local_244 < 0x10) {
        if (local_244 == 0xffffffc0) {
          local_220[0] = 0x34362d;
          fp_r4stat(local_1f8,local_254,&local_e8,&local_1b8,&local_23c);
LAB_00108b1a:
          local_240 = 0x40;
        }
        else if (local_244 == 0xffffffe0) {
          local_220[0] = 0x32332d;
          fp_r4stat(local_1f8,local_254,&local_e8,&local_1b8,&local_23c);
LAB_00108ba8:
          local_240 = 0x20;
        }
        else if (local_244 == 8) {
          local_220[0] = 0x202038;
          fp_i2stat(local_1f8,local_254,&local_e8,&local_1b8,&local_23c);
          local_240 = 8;
        }
      }
      else if (local_244 == 0x10) {
        local_220[0] = 0x203631;
        fp_i2stat(local_1f8,local_254,&local_e8,&local_1b8,&local_23c);
        local_240 = 0x10;
      }
      else {
        if (local_244 == 0x20) {
          local_220[0] = 0x203233;
          fp_i4stat(local_1f8,local_254,&local_e8,&local_1b8,&local_23c);
          goto LAB_00108ba8;
        }
        if (local_244 == 0x40) {
          local_220[0] = 0x203436;
          goto LAB_00108b1a;
        }
      }
      dVar21 = local_1b8.noise2;
      if (local_1b8.noise2 == 0.0 || local_1b8.noise3 <= local_1b8.noise2) {
        dVar21 = local_1b8.noise3;
      }
      local_118 = local_1b8.noise2;
      uStack_110 = 0;
      local_108 = local_1b8.noise3;
      uStack_100 = 0;
      uVar17 = SUB84(local_1b8.noise5,0);
      uVar18 = (undefined4)((ulong)local_1b8.noise5 >> 0x20);
      local_128 = local_1b8.noise5;
      uStack_120 = 0;
      if (local_1b8.noise5 == 0.0 || dVar21 <= local_1b8.noise5) {
        uVar17 = SUB84(dVar21,0);
        uVar18 = (undefined4)((ulong)dVar21 >> 0x20);
      }
      local_170 = (double)CONCAT44(uVar18,uVar17);
      dVar21 = log10((double)CONCAT44(uVar18,uVar17));
      local_218 = dVar21 / 0.301 + 1.792;
      printf("\n File: %s\n",local_1d8);
      puts(
          "  Ext BITPIX Dimens.   Nulls    Min    Max     Mean    Sigma  Noise2  Noise3  Noise5  Nbits   MaxR"
          );
      printf("  %3d  %s",(ulong)local_238,local_220);
      snprintf(local_98,100," (%ld",local_e8);
      iVar5 = local_254;
      if (1 < local_254) {
        sVar7 = strlen(local_98);
        lVar9 = 1;
        do {
          iVar6 = (int)sVar7;
          if (iVar6 < 99) {
            snprintf(local_98 + iVar6,(ulong)(100 - iVar6),",%ld",(&local_e8)[lVar9]);
            iVar5 = local_254;
          }
          sVar7 = strlen(local_98);
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar5);
      }
      sVar7 = strlen(local_98);
      if (sVar7 < 99) {
        sVar7 = strlen(local_98);
        (local_98 + sVar7)[0] = ')';
        (local_98 + sVar7)[1] = '\0';
      }
      local_218 = (double)CONCAT44(local_218._4_4_,(float)local_218);
      printf("%-12s",local_98);
      ffghad(local_250,&local_f0,&local_130,&local_138,&local_23c);
      lVar4 = local_130;
      lVar9 = local_138;
      fits_read_image_speed(local_1f8,&local_1cc,&local_1c8,&local_1fc,&local_200,&local_23c);
      iVar5 = local_1b8.n_nulls;
      local_908 = (double)((float)local_240 / local_218._0_4_);
      local_218 = local_1b8.minval;
      local_148 = local_1b8.maxval;
      local_150 = local_1b8.mean;
      local_158 = local_1b8.sigma;
      printf(" %5d %6.0f %6.0f %8.1f %#8.2g %#7.3g %#7.3g %#7.3g %#5.1f %#6.2f\n",
             (ulong)(uint)local_1b8.n_nulls);
      puts("\n       Type   Ratio       Size (MB)     Pk (Sec) UnPk Exact ElpN CPUN  Elp1  CPU1");
      local_160 = (double)local_1cc;
      local_168 = (double)local_1c8;
      printf("       Native                                             %5.3f %5.3f %5.3f %5.3f\n");
      if (in_stack_0000049c != '\0') {
        local_8e0 = (double)local_1fc;
        local_8d8 = (double)local_200;
        local_8e8 = local_168;
        local_8f0 = local_160;
        local_8f8 = local_128;
        local_900 = iVar5;
        local_908 = local_e0[0];
        fprintf((FILE *)outreport,
                " %s  %d %d %ld %ld %#10.4g %d %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g"
                ,SUB84((double)(float)((double)(lVar9 - lVar4) / 1000000.0),0),SUB84(local_218,0),
                SUB84(local_148,0),SUB84(local_150,0),SUB84(local_158,0),local_1b8.noise1,
                local_118._0_4_,local_108,local_1d8,(ulong)local_238,(ulong)local_244,local_e8);
      }
      fits_set_lossy_int(local_260,iStack0000000000000028,&local_23c);
      if (((0 < (int)local_244) && (iStack0000000000000028 != 0)) &&
         ((local_170 < (double)(fStack000000000000002c * fStack000000000000000c) ||
          (local_170 < (double)in_stack_00000030)))) {
        fits_set_lossy_int(local_260,0,&local_23c);
        ffghdn(local_1f8,(int *)&local_234);
        printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n"
               ,(ulong)local_234);
      }
      if ((fStack000000000000000c != 0.0) || (NAN(fStack000000000000000c))) {
        fits_set_compression_type(local_260,0xb,&local_23c);
        fits_set_tile_dim(local_260,6,local_1c0,&local_23c);
        fits_set_quantize_method
                  (local_260,-(uint)(iStack0000000000000010 != 0) | uStack0000000000000018,
                   &local_23c);
        fits_set_quantize_level(local_260,fStack000000000000000c,&local_23c);
        fits_set_dither_offset(local_260,iStack0000000000000014,&local_23c);
        fits_set_hcomp_scale(local_260,fStack000000000000001c,&local_23c);
        fits_set_hcomp_smooth(local_260,iStack0000000000000024,&local_23c);
        pfVar2 = local_208;
        pfVar1 = local_260;
        puVar13 = (undefined8 *)&stack0x00000008;
        pdVar15 = &local_908;
        for (lVar9 = 0xd5; lVar9 != 0; lVar9 = lVar9 + -1) {
          *pdVar15 = (double)*puVar13;
          puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
          pdVar15 = pdVar15 + (ulong)bVar16 * -2 + 1;
        }
        fp_test_hdu(local_1f8,pfVar1,pfVar2,&local_23c);
      }
      plVar12 = local_1c0;
      pfVar1 = local_1f8;
      if ((fStack000000000000000c != 0.0) || (NAN(fStack000000000000000c))) {
        fits_set_compression_type(local_260,0x29,&local_23c);
        fits_set_tile_dim(local_260,6,plVar12,&local_23c);
        fits_set_quantize_method
                  (local_260,-(uint)(iStack0000000000000010 != 0) | uStack0000000000000018,
                   &local_23c);
        fits_set_quantize_level(local_260,fStack000000000000000c,&local_23c);
        fits_set_dither_offset(local_260,iStack0000000000000014,&local_23c);
        fits_set_hcomp_scale(local_260,fStack000000000000001c,&local_23c);
        fits_set_hcomp_smooth(local_260,iStack0000000000000024,&local_23c);
        pfVar3 = local_208;
        pfVar2 = local_260;
        puVar13 = (undefined8 *)&stack0x00000008;
        pdVar15 = &local_908;
        for (lVar9 = 0xd5; lVar9 != 0; lVar9 = lVar9 + -1) {
          *pdVar15 = (double)*puVar13;
          puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
          pdVar15 = pdVar15 + (ulong)bVar16 * -2 + 1;
        }
        fp_test_hdu(pfVar1,pfVar2,pfVar3,&local_23c);
      }
      fits_set_compression_type(local_260,(iStack0000000000000008 == 0x16) + 0x15,&local_23c);
      fits_set_tile_dim(local_260,6,plVar12,&local_23c);
      fits_set_quantize_method
                (local_260,-(uint)(iStack0000000000000010 != 0) | uStack0000000000000018,&local_23c)
      ;
      fits_set_quantize_level(local_260,fStack000000000000000c,&local_23c);
      fits_set_dither_offset(local_260,iStack0000000000000014,&local_23c);
      fits_set_hcomp_scale(local_260,fStack000000000000001c,&local_23c);
      fits_set_hcomp_smooth(local_260,iStack0000000000000024,&local_23c);
      pfVar3 = local_208;
      pfVar2 = local_260;
      puVar13 = (undefined8 *)&stack0x00000008;
      pdVar15 = &local_908;
      for (lVar9 = 0xd5; lVar9 != 0; lVar9 = lVar9 + -1) {
        *pdVar15 = (double)*puVar13;
        puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
        pdVar15 = pdVar15 + (ulong)bVar16 * -2 + 1;
      }
      fp_test_hdu(pfVar1,pfVar2,pfVar3,&local_23c);
      if (in_stack_0000049c != '\0') {
        fputc(10,(FILE *)outreport);
      }
      if ((char)local_210 == '\0') {
        ffdelt(local_1f8,&local_23c);
        tempfilename3[0] = '\0';
      }
    }
    else if ((local_22c == 2) && (in_stack_00000088 != 0)) {
      ffgnrwll(local_250,&local_140,&local_23c);
      ffgncl(local_250,(int *)&local_1c4,&local_23c);
      printf("\n File: %s, HDU %d,  %d cols X %lld rows\n",local_1d8,(ulong)local_238,
             (ulong)local_1c4);
      pfVar2 = local_250;
      pfVar1 = local_260;
      puVar13 = (undefined8 *)&stack0x00000008;
      pdVar15 = &local_908;
      for (lVar9 = 0xd5; lVar9 != 0; lVar9 = lVar9 + -1) {
        *pdVar15 = (double)*puVar13;
        puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
        pdVar15 = pdVar15 + (ulong)bVar16 * -2 + 1;
      }
      fp_test_table(pfVar2,pfVar1,pfVar1,&local_23c);
    }
    else {
      ffcopy(local_250,local_260,0,&local_23c);
      ffcopy(local_250,local_208,0,&local_23c);
    }
    ffmrhd(local_250,1,(int *)0x0,&local_23c);
    local_238 = local_238 + 1;
    iVar5 = local_23c;
  } while( true );
}

Assistant:

int fp_test (char *infits, char *outfits, char *outfits2, fpstate fpvar)
{
	fitsfile *inputfptr, *infptr, *outfptr, *outfptr2, *tempfile;

	long	naxes[9] = {1, 1, 1, 1, 1, 1, 1, 1, 1};
	int	stat=0, totpix=0, naxis=0, ii, hdutype, bitpix = 0, extnum = 0, len;
	int     tstatus = 0, hdunum, rescale_flag, bpix, ncols;
	char	dtype[8], dimen[100];
	double  bscale, rescale, noisemin;
	long headstart, datastart, dataend;
	float origdata = 0., whole_cpu, whole_elapse, row_elapse, row_cpu, xbits;

	LONGLONG nrows;
	/* structure to hold image statistics (defined in fpack.h) */
	imgstats imagestats;

	fits_open_file (&inputfptr, infits, READONLY, &stat);
	fits_create_file (&outfptr, outfits, &stat);
	fits_create_file (&outfptr2, outfits2, &stat);

	if (stat) { fits_report_error (stderr, stat); exit (stat); }

	while (! stat) {
	    
	    /*  LOOP OVER EACH HDU */
	    rescale_flag = 0;
	    fits_get_hdu_type (inputfptr, &hdutype, &stat);

	    if (hdutype == IMAGE_HDU) {
	        fits_get_img_param (inputfptr, 9, &bitpix, &naxis, naxes, &stat);
	        for (totpix=1, ii=0; ii < 9; ii++) totpix *= naxes[ii];
	    }

	    if (!fits_is_compressed_image (inputfptr,  &stat) && hdutype == IMAGE_HDU &&
		naxis != 0 && totpix != 0 && fpvar.do_images) {

		/* rescale a scaled integer image to reduce noise? */
		if (fpvar.rescale_noise != 0. && bitpix > 0 && bitpix < LONGLONG_IMG) {

		   tstatus = 0;
		   fits_read_key(inputfptr, TDOUBLE, "BSCALE", &bscale, 0, &tstatus);

		   if (tstatus == 0 && bscale != 1.0) {  /* image must be scaled */

			if (bitpix == LONG_IMG)
			  fp_i4stat(inputfptr, naxis, naxes, &imagestats, &stat);
			else
			  fp_i2stat(inputfptr, naxis, naxes, &imagestats, &stat);

			/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
			noisemin = imagestats.noise3;
			if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
			if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

			rescale = noisemin / fpvar.rescale_noise;
			if (rescale > 1.0) {
			  
			  /* all the criteria are met, so create a temporary file that */
			  /* contains a rescaled version of the image, in CWD */
			  
                	  /* create temporary file name */
			  fp_tmpnam("Tmpfile3", "", tempfilename3);

			  fits_create_file(&tempfile, tempfilename3, &stat);

			  fits_get_hdu_num(inputfptr, &hdunum);
			  if (hdunum != 1) {

			     /* the input hdu is an image extension, so create dummy primary */
			     fits_create_img(tempfile, 8, 0, naxes, &stat);
			  }

			  fits_copy_header(inputfptr, tempfile, &stat); /* copy the header */
			  
			  /* rescale the data, so that it will compress more efficiently */
			  if (bitpix == LONG_IMG)
			    fp_i4rescale(inputfptr, naxis, naxes, rescale, tempfile, &stat);
			  else
			    fp_i2rescale(inputfptr, naxis, naxes, rescale, tempfile, &stat);

			  /* scale the BSCALE keyword by the inverse factor */

			  bscale = bscale * rescale;  
			  fits_update_key(tempfile, TDOUBLE, "BSCALE", &bscale, 0, &stat);

			  /* rescan the header, to reset the actual scaling parameters */
			  fits_set_hdustruc(tempfile, &stat);

			  infptr = tempfile;
			  rescale_flag = 1;
			}
		   }
		 }

		if (!rescale_flag)   /* just compress the input file, without rescaling */
		   infptr = inputfptr;

		/* compute basic statistics about the input image */
                if (bitpix == BYTE_IMG) {
		   bpix = 8;
		   strcpy(dtype, "8  ");
		   fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == SHORT_IMG) {
		   bpix = 16;
		   strcpy(dtype, "16 ");
		   fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == LONG_IMG) {
		   bpix = 32;
		   strcpy(dtype, "32 ");
		   fp_i4stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == LONGLONG_IMG) {
		   bpix = 64;
		   strcpy(dtype, "64 ");
		} else if (bitpix == FLOAT_IMG)   {
		   bpix = 32;
		   strcpy(dtype, "-32");
		   fp_r4stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == DOUBLE_IMG)  {
		   bpix = 64;
		   strcpy(dtype, "-64");
		   fp_r4stat(infptr, naxis, naxes, &imagestats, &stat);
		}

		/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
		noisemin = imagestats.noise3;
		if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
		if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

                xbits = (float) (log10(noisemin)/.301 + 1.792);

		printf("\n File: %s\n", infits);
		printf("  Ext BITPIX Dimens.   Nulls    Min    Max     Mean    Sigma  Noise2  Noise3  Noise5  Nbits   MaxR\n");

		printf("  %3d  %s", extnum, dtype);
		snprintf(dimen,100," (%ld", naxes[0]);
		len =strlen(dimen);
		for (ii = 1; ii < naxis; ii++) {
                    if (len < 99)
		       snprintf(dimen+len,100-len,",%ld", naxes[ii]);
		    len =strlen(dimen);
		}
                if (strlen(dimen)<99)
		   strcat(dimen, ")");
		printf("%-12s",dimen);

		fits_get_hduaddr(inputfptr, &headstart, &datastart, &dataend, &stat);
		origdata = (float) ((dataend - datastart)/1000000.);

		/* get elapsed and cpu times need to read the uncompressed image */
		fits_read_image_speed (infptr, &whole_elapse, &whole_cpu,
		               &row_elapse, &row_cpu, &stat);

		printf(" %5d %6.0f %6.0f %8.1f %#8.2g %#7.3g %#7.3g %#7.3g %#5.1f %#6.2f\n",
		        imagestats.n_nulls, imagestats.minval, imagestats.maxval, 
		      imagestats.mean, imagestats.sigma, 
		      imagestats.noise2, imagestats.noise3, imagestats.noise5, xbits, bpix/xbits);

		printf("\n       Type   Ratio       Size (MB)     Pk (Sec) UnPk Exact ElpN CPUN  Elp1  CPU1\n");

		printf("       Native                                             %5.3f %5.3f %5.3f %5.3f\n",
		        whole_elapse, whole_cpu, row_elapse, row_cpu);

		if (fpvar.outfile[0]) {
		    fprintf(outreport,
	" %s  %d %d %ld %ld %#10.4g %d %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g",
		      infits, extnum, bitpix, naxes[0], naxes[1], origdata, imagestats.n_nulls, imagestats.minval, 
		      imagestats.maxval, imagestats.mean, imagestats.sigma, 
		      imagestats.noise1, imagestats.noise2, imagestats.noise3, imagestats.noise5, whole_elapse, whole_cpu, row_elapse, row_cpu);
		}

		fits_set_lossy_int (outfptr, fpvar.int_to_float, &stat);
		if ( (bitpix > 0) && (fpvar.int_to_float != 0) ) {

			if ( (noisemin < (fpvar.n3ratio * fpvar.quantize_level) ) ||
			    (noisemin < fpvar.n3min)) {
			
			    /* image contains too little noise to quantize effectively */
			    fits_set_lossy_int (outfptr, 0, &stat);
			    fits_get_hdu_num(infptr, &hdunum);

printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n", hdunum);
			} 
		}

		/* test compression ratio and speed for each algorithm */

		if (fpvar.quantize_level != 0) {

		  fits_set_compression_type (outfptr, RICE_1, &stat);
		  fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		  if (fpvar.no_dither)
	    	    fits_set_quantize_method(outfptr, -1, &stat);
		  else
	    	    fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

		  fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
		  fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
		  fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
		  fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

		  fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
		}

		if (fpvar.quantize_level != 0) {
\
  		  fits_set_compression_type (outfptr, HCOMPRESS_1, &stat);
		  fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);

		  if (fpvar.no_dither)
	    	    fits_set_quantize_method(outfptr, -1, &stat);
		  else
	    	    fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

		  fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
		  fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
		  fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
		  fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

		  fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
		}

		if (fpvar.comptype == GZIP_2) {
		    fits_set_compression_type (outfptr, GZIP_2, &stat);
		} else {
		    fits_set_compression_type (outfptr, GZIP_1, &stat);
		}

		fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);

		if (fpvar.no_dither)
	    	    fits_set_quantize_method(outfptr, -1, &stat);
		else
	    	    fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

		fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
		fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
		fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
		fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

		fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);

/*
		fits_set_compression_type (outfptr, BZIP2_1, &stat);
		fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
*/
/*
		fits_set_compression_type (outfptr, PLIO_1, &stat);
		fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
*/
/*
                if (bitpix == SHORT_IMG || bitpix == LONG_IMG) {
		  fits_set_compression_type (outfptr, NOCOMPRESS, &stat);
		  fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		  fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);	  
		}
*/
		if (fpvar.outfile[0])
		    fprintf(outreport,"\n");

		/* delete the temporary file */
		if (rescale_flag)  { 
		    fits_delete_file (infptr, &stat);
		    tempfilename3[0] = '\0';   /* clear the temp filename */ 
                }
	    } else if ( (hdutype == BINARY_TBL) && fpvar.do_tables) {

    		fits_get_num_rowsll(inputfptr, &nrows, &stat);
    		fits_get_num_cols(inputfptr, &ncols, &stat);
#if defined(_MSC_VER)
                /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
 		printf("\n File: %s, HDU %d,  %d cols X %I64d rows\n", infits, extnum, ncols, nrows);
#elif (USE_LL_SUFFIX == 1)
 		printf("\n File: %s, HDU %d,  %d cols X %lld rows\n", infits, extnum, ncols, nrows);
#else
 		printf("\n File: %s, HDU %d,  %d cols X %ld rows\n", infits, extnum, ncols, nrows);
#endif
		fp_test_table(inputfptr, outfptr, outfptr2, fpvar, &stat);	  

	    } else {
		fits_copy_hdu (inputfptr, outfptr, 0, &stat);
		fits_copy_hdu (inputfptr, outfptr2, 0, &stat);
	    }

	    fits_movrel_hdu (inputfptr, 1, NULL, &stat);
            extnum++;
	}


	if (stat == END_OF_FILE) stat = 0;

	fits_close_file (outfptr2, &stat);
	fits_close_file (outfptr, &stat);
	fits_close_file (inputfptr, &stat);

	if (stat) {
	  fits_report_error (stderr, stat);
	}
	return(0);
}